

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

ON_2dPoint __thiscall ON_OBSOLETE_V5_Annotation::Point(ON_OBSOLETE_V5_Annotation *this,int idx)

{
  ON_2dPoint OVar1;
  int iVar2;
  ON_2dPoint *pOVar3;
  int idx_local;
  ON_OBSOLETE_V5_Annotation *this_local;
  double local_10;
  
  if (-1 < idx) {
    iVar2 = ON_SimpleArray<ON_2dPoint>::Count(&(this->m_points).super_ON_SimpleArray<ON_2dPoint>);
    if (idx < iVar2) {
      pOVar3 = ON_SimpleArray<ON_2dPoint>::operator[]
                         (&(this->m_points).super_ON_SimpleArray<ON_2dPoint>,idx);
      this_local = (ON_OBSOLETE_V5_Annotation *)pOVar3->x;
      local_10 = pOVar3->y;
      goto LAB_00668f4f;
    }
  }
  ON_2dPoint::ON_2dPoint((ON_2dPoint *)&this_local,0.0,0.0);
LAB_00668f4f:
  OVar1.y = local_10;
  OVar1.x = (double)this_local;
  return OVar1;
}

Assistant:

ON_2dPoint ON_OBSOLETE_V5_Annotation::Point( int idx ) const
{
  return ( idx >= 0 && idx < m_points.Count() ) 
         ? m_points[idx] 
         : ON_2dPoint( 0.0, 0.0 );
}